

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_main.cpp
# Opt level: O1

int DoomSpecificInfo(char *buffer,char *end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint wadnum;
  ulong uVar6;
  int iVar7;
  
  iVar7 = ((int)end - (int)buffer) + -2;
  pcVar4 = GetVersionString();
  pcVar5 = GetGitHash();
  iVar1 = snprintf(buffer,(long)iVar7,"ZDoom version %s (%s)\n",pcVar4,pcVar5);
  iVar2 = snprintf(buffer + iVar1,(long)(iVar7 - iVar1),"Compiler version: %s\n",
                   "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                  );
  iVar2 = iVar2 + iVar1;
  iVar1 = snprintf(buffer + iVar2,(long)(iVar7 - iVar2),"\nCommand line:");
  iVar1 = iVar1 + iVar2;
  iVar2 = DArgs::NumArgs(Args);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      pcVar4 = DArgs::GetArg(Args,iVar2);
      iVar3 = snprintf(buffer + iVar1,(long)(iVar7 - iVar1)," %s",pcVar4);
      iVar1 = iVar3 + iVar1;
      iVar2 = iVar2 + 1;
      iVar3 = DArgs::NumArgs(Args);
    } while (iVar2 < iVar3);
  }
  iVar2 = snprintf(buffer + iVar1,(long)(iVar7 - iVar1),"\n");
  iVar2 = iVar2 + iVar1;
  pcVar4 = FWadCollection::GetWadName(&Wads,0);
  if (pcVar4 != (char *)0x0) {
    uVar6 = 0;
    do {
      iVar1 = snprintf(buffer + iVar2,(long)(iVar7 - iVar2),"\nWad %d: %s",uVar6,pcVar4);
      iVar2 = iVar1 + iVar2;
      wadnum = (int)uVar6 + 1;
      uVar6 = (ulong)wadnum;
      pcVar4 = FWadCollection::GetWadName(&Wads,wadnum);
    } while (pcVar4 != (char *)0x0);
  }
  if ((gamestate == GS_LEVEL) || (gamestate == GS_TITLELEVEL)) {
    iVar1 = snprintf(buffer + iVar2,(long)(iVar7 - iVar2),"\n\nCurrent map: %s",level.MapName.Chars)
    ;
    iVar1 = iVar1 + iVar2;
    if (viewactive == false) {
      iVar7 = snprintf(buffer + iVar1,(long)(iVar7 - iVar1),"\n\nView not active.");
      iVar7 = iVar7 + iVar1;
    }
    else {
      iVar2 = snprintf(buffer + iVar1,(long)(iVar7 - iVar1),"\n\nviewx = %f",ViewPos.X);
      iVar2 = iVar2 + iVar1;
      iVar1 = snprintf(buffer + iVar2,(long)(iVar7 - iVar2),"\nviewy = %f",ViewPos.Y);
      iVar1 = iVar1 + iVar2;
      iVar2 = snprintf(buffer + iVar1,(long)(iVar7 - iVar1),"\nviewz = %f",ViewPos.Z);
      iVar2 = iVar2 + iVar1;
      iVar7 = snprintf(buffer + iVar2,(long)(iVar7 - iVar2),"\nviewangle = %f",ViewAngle.Degrees);
      iVar7 = iVar7 + iVar2;
    }
  }
  else {
    iVar7 = snprintf(buffer + iVar2,(long)(iVar7 - iVar2),"\n\nNot in a level.");
    iVar7 = iVar7 + iVar2;
  }
  (buffer + iVar7)[0] = '\n';
  (buffer + iVar7)[1] = '\0';
  return iVar7 + 2;
}

Assistant:

static int DoomSpecificInfo (char *buffer, char *end)
{
	const char *arg;
	int size = end-buffer-2;
	int i, p;

	p = 0;
	p += snprintf (buffer+p, size-p, GAMENAME" version %s (%s)\n", GetVersionString(), GetGitHash());
#ifdef __VERSION__
	p += snprintf (buffer+p, size-p, "Compiler version: %s\n", __VERSION__);
#endif
	p += snprintf (buffer+p, size-p, "\nCommand line:");
	for (i = 0; i < Args->NumArgs(); ++i)
	{
		p += snprintf (buffer+p, size-p, " %s", Args->GetArg(i));
	}
	p += snprintf (buffer+p, size-p, "\n");
	
	for (i = 0; (arg = Wads.GetWadName (i)) != NULL; ++i)
	{
		p += snprintf (buffer+p, size-p, "\nWad %d: %s", i, arg);
	}

	if (gamestate != GS_LEVEL && gamestate != GS_TITLELEVEL)
	{
		p += snprintf (buffer+p, size-p, "\n\nNot in a level.");
	}
	else
	{
		p += snprintf (buffer+p, size-p, "\n\nCurrent map: %s", level.MapName.GetChars());

		if (!viewactive)
		{
			p += snprintf (buffer+p, size-p, "\n\nView not active.");
		}
		else
		{
			p += snprintf (buffer+p, size-p, "\n\nviewx = %f", ViewPos.X);
			p += snprintf (buffer+p, size-p, "\nviewy = %f", ViewPos.Y);
			p += snprintf (buffer+p, size-p, "\nviewz = %f", ViewPos.Z);
			p += snprintf (buffer+p, size-p, "\nviewangle = %f", ViewAngle.Degrees);
		}
	}
	buffer[p++] = '\n';
	buffer[p++] = '\0';

	return p;
}